

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsTorqueConverter::ArchiveOUT(ChShaftsTorqueConverter *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsTorqueConverter>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_38._value = &this->K;
  local_38._name = "K";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->T;
  local_38._name = "T";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsTorqueConverter::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsTorqueConverter>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(K);
    marchive << CHNVP(T);
    // marchive << CHNVP(shaft1); //***TODO*** serialize with shared ptr
    // marchive << CHNVP(shaft2); //***TODO*** serialize with shared ptr
    // marchive << CHNVP(shaft_stator); //***TODO*** serialize with shared ptr
}